

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::vector<Rectangle3,std::allocator<Rectangle3>>>
               (string *header,vector<Rectangle3,_std::allocator<Rectangle3>_> *list,
               function<void_(Rectangle3,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
               *converter,Options *options)

{
  vector<Rectangle3,_std::allocator<Rectangle3>_> *in_RDX;
  Options *in_stack_00000150;
  function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *in_stack_00000158;
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  *in_stack_00000160;
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  *in_stack_00000168;
  string *in_stack_00000170;
  function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *in_stack_ffffffffffffffa0;
  function<void_(Rectangle3,_std::basic_ostream<char,_std::char_traits<char>_>_&)> local_50;
  Rectangle3 *local_30;
  Rectangle3 *local_28;
  
  local_28 = (Rectangle3 *)::std::vector<Rectangle3,_std::allocator<Rectangle3>_>::begin(in_RDX);
  local_30 = (Rectangle3 *)::std::vector<Rectangle3,_std::allocator<Rectangle3>_>::end(in_RDX);
  ::std::function<void(Rectangle3_const&,std::ostream&)>::
  function<std::function<void(Rectangle3,std::ostream&)>&,void>(in_stack_ffffffffffffffa0,&local_50)
  ;
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<__gnu_cxx::__normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>_>
            (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
             in_stack_00000150);
  ::std::function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>::
  ~function((function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
             *)0x1901b1);
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }